

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.cpp
# Opt level: O3

bool __thiscall
ZAP::ArchiveBuilder::buildFile(ArchiveBuilder *this,string *filename,Compression compression)

{
  char cVar1;
  bool bVar2;
  ofstream stream;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  std::ofstream::ofstream(&local_210,(string *)filename,_S_trunc|_S_out|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    bVar2 = false;
  }
  else {
    bVar2 = build(this,(ostream *)&local_210,compression);
  }
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return bVar2;
}

Assistant:

bool ArchiveBuilder::buildFile(const std::string &filename, Compression compression)
	{
		std::ofstream stream(filename, std::ios::out | std::ios::trunc | std::ios::binary);
		if (!stream.is_open())
		{
			return false;
		}
		return build(stream, compression);
	}